

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_badAnyCastWithIndices_Test::TestBody(Annotator_badAnyCastWithIndices_Test *this)

{
  shared_ptr *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  ModelPtr m;
  ParserPtr parser;
  shared_ptr<libcellml::Component> sStack_88;
  long *local_78 [2];
  long local_68 [2];
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  void *local_48;
  shared_ptr *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Parser::create(SUB81(local_20,0));
  libcellml::Parser::parseModel(local_30);
  libcellml::Annotator::create();
  libcellml::Annotator::setModel(local_40);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::component((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_58,"nullptr","annotator->component(\"duplicateId\", 0)",&local_48,&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7f9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::componentEncapsulation((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_58,"nullptr","annotator->componentEncapsulation(\"duplicateId\", 0)",&local_48,
             &sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::connection((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_58,"nullptr","annotator->connection(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::VariablePair> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::encapsulation((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_58,"nullptr","annotator->encapsulation(\"duplicateId\", 1)",&local_48,
             (shared_ptr<libcellml::Model> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fc,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::importSource((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_58,"nullptr","annotator->importSource(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::ImportSource> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::model((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_58,"nullptr","annotator->model(\"duplicateId\", 1)",&local_48,
             (shared_ptr<libcellml::Model> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7fe,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::mapVariables((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_58,"nullptr","annotator->mapVariables(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::VariablePair> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x7ff,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::reset((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->reset(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x800,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::resetValue((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->resetValue(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x801,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::testValue((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->testValue(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x802,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::unitsItem((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_58,"nullptr","annotator->unitsItem(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::UnitsItem> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x803,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::units((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_58,"nullptr","annotator->units(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::Units> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x804,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::variable((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_58,"nullptr","annotator->variable(\"duplicateId\", 0)",&local_48,
             (shared_ptr<libcellml::Variable> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x805,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::component((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_58,"nullptr","annotator->component(\"duplicateId\", 99)",&local_48,&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x807,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::componentEncapsulation((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Component>>
            (local_58,"nullptr","annotator->componentEncapsulation(\"duplicateId\", 99)",&local_48,
             &sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x808,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::connection((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_58,"nullptr","annotator->connection(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::VariablePair> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x809,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::encapsulation((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_58,"nullptr","annotator->encapsulation(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Model> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::importSource((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::ImportSource>>
            (local_58,"nullptr","annotator->importSource(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::ImportSource> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::model((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Model>>
            (local_58,"nullptr","annotator->model(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Model> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::mapVariables((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::VariablePair>>
            (local_58,"nullptr","annotator->mapVariables(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::VariablePair> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::reset((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->reset(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::resetValue((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->resetValue(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x80f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::testValue((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Reset>>
            (local_58,"nullptr","annotator->testValue(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Reset> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x810,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::unitsItem((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::UnitsItem>>
            (local_58,"nullptr","annotator->unitsItem(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::UnitsItem> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x811,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  psVar1 = local_40;
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::units((string *)&sStack_88,(ulong)psVar1);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Units>>
            (local_58,"nullptr","annotator->units(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Units> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x812,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48 = (void *)0x0;
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"duplicateId","");
  libcellml::Annotator::variable((string *)&sStack_88,(ulong)local_40);
  testing::internal::CmpHelperEQ<decltype(nullptr),std::shared_ptr<libcellml::Variable>>
            (local_58,"nullptr","annotator->variable(\"duplicateId\", 99)",&local_48,
             (shared_ptr<libcellml::Variable> *)&sStack_88);
  if (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sStack_88.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_78);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sStack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x813,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sStack_88,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sStack_88);
    if (local_78[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_78[0] != (long *)0x0)) {
        (**(code **)(*local_78[0] + 8))();
      }
      local_78[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

TEST(Annotator, badAnyCastWithIndices)
{
    auto parser = libcellml::Parser::create();
    auto m = parser->parseModel(modelStringDuplicateIds);
    auto annotator = libcellml::Annotator::create();
    annotator->setModel(m);

    // Trigger errors on all items because of miscasting:
    EXPECT_EQ(nullptr, annotator->component("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->connection("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId", 1));
    EXPECT_EQ(nullptr, annotator->importSource("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->model("duplicateId", 1));
    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->reset("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->testValue("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->units("duplicateId", 0));
    EXPECT_EQ(nullptr, annotator->variable("duplicateId", 0));

    EXPECT_EQ(nullptr, annotator->component("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->componentEncapsulation("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->connection("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->encapsulation("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->importSource("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->model("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->mapVariables("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->reset("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->resetValue("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->testValue("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->unitsItem("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->units("duplicateId", 99));
    EXPECT_EQ(nullptr, annotator->variable("duplicateId", 99));
}